

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

int jmp_novalue(FuncState *fs,BCPos list)

{
  uint uVar1;
  long lVar2;
  
  while( true ) {
    if (list == 0xffffffff) {
      return 0;
    }
    uVar1 = list - 1;
    if (list == 0) {
      uVar1 = 0;
    }
    uVar1 = fs->bcbase[uVar1].ins;
    if ((uVar1 & 0xfe) != 0xc && (~uVar1 & 0xff00) != 0) break;
    lVar2 = (ulong)*(ushort *)((long)&fs->bcbase[list].ins + 2) - 0x8000;
    list = list + 1 + (int)lVar2;
    if (lVar2 == -1) {
      list = 0xffffffff;
    }
  }
  return 1;
}

Assistant:

static int jmp_novalue(FuncState *fs, BCPos list)
{
  for (; list != NO_JMP; list = jmp_next(fs, list)) {
    BCIns p = fs->bcbase[list >= 1 ? list-1 : list].ins;
    if (!(bc_op(p) == BC_ISTC || bc_op(p) == BC_ISFC || bc_a(p) == NO_REG))
      return 1;
  }
  return 0;
}